

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_validate.cpp
# Opt level: O0

void __thiscall ktx::CommandValidate::executeValidate(CommandValidate *this)

{
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view filepath;
  string_view filepath_00;
  int iVar1;
  function<void_(const_ktx::ValidationReport_&)> *callback;
  ulong uVar2;
  size_t sVar3;
  undefined8 uVar4;
  istream *piVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar6;
  FatalError *this_00;
  undefined2 extraout_var;
  char **args_03;
  ostringstream *this_01;
  long in_RDI;
  PrintIndent out;
  int validationResult_1;
  bool first;
  PrintIndent pi;
  ostringstream messagesOS_1;
  char *nl;
  char *space;
  int indent_width;
  int base_indent;
  __string_type validationMessages;
  int validationResult;
  ostringstream messagesOS;
  InputStream inputStream;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*> *vargs;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *vargs_1;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_2;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs_3;
  ReturnCode in_stack_fffffffffffff3bc;
  InputStream *in_stack_fffffffffffff3c0;
  anon_class_32_4_d1f13690 *in_stack_fffffffffffff3c8;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffff3d0;
  unsigned_long_long in_stack_fffffffffffff3d8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  *paVar7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_stack_fffffffffffff3e0;
  undefined4 in_stack_fffffffffffff3e8;
  undefined2 in_stack_fffffffffffff3ec;
  undefined1 in_stack_fffffffffffff3ee;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffff3ef;
  undefined1 uVar9;
  size_t in_stack_fffffffffffff3f0;
  char **in_stack_fffffffffffff400;
  char **in_stack_fffffffffffff408;
  char (*in_stack_fffffffffffff410) [65];
  size_t *psVar10;
  undefined4 in_stack_fffffffffffff418;
  int in_stack_fffffffffffff41c;
  PrintIndent *in_stack_fffffffffffff420;
  undefined8 in_stack_fffffffffffff428;
  int depth;
  PrintIndent *in_stack_fffffffffffff430;
  Reporter *in_stack_fffffffffffff490;
  string *in_stack_fffffffffffff498;
  InputStream *in_stack_fffffffffffff4a0;
  char *local_b50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_b48;
  undefined1 local_b39;
  undefined8 *local_b38;
  undefined4 local_b30;
  int local_b2c;
  byte *local_b28;
  ostringstream **local_b20;
  char **local_b18;
  char **local_b10;
  undefined1 local_ae8 [16];
  string local_ad8 [32];
  int local_ab8;
  byte local_ab1;
  ostringstream *local_ab0;
  undefined4 local_aa8;
  int local_aa4;
  ostringstream local_aa0 [376];
  char *local_928;
  char *local_920;
  int local_918;
  undefined4 local_914;
  char *local_910;
  size_t local_908;
  char *local_900;
  size_t local_8f8;
  undefined1 local_8f0 [8];
  char *local_8e8 [2];
  string local_8d8 [32];
  ostringstream *local_8b8;
  function<void_(const_ktx::ValidationReport_&)> *in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff778;
  undefined2 uVar11;
  string *in_stack_fffffffffffff780;
  istream *in_stack_fffffffffffff788;
  ostringstream local_850 [376];
  InputStream local_6d8;
  undefined8 local_318;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_310;
  char *local_308;
  size_t local_300;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_2f8 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_2e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  *local_2e0;
  char *local_2d8;
  size_t sStack_2d0;
  char *local_2c8;
  char **local_2c0;
  undefined8 local_2b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_2b0;
  char *local_2a8;
  size_t local_2a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_298 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_280;
  char *local_278;
  size_t sStack_270;
  char *local_268;
  char **local_260;
  undefined8 local_258;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_250;
  char *local_248;
  size_t local_240;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_238 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_228;
  string *local_220;
  char *local_218;
  size_t sStack_210;
  char *local_208;
  char **local_200;
  undefined8 local_1f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1f0;
  char *local_1e8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_1e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aStack_1a8;
  char *local_1a0;
  char **local_198;
  char **local_190;
  char *local_188;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aStack_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_178;
  undefined8 *local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_168;
  undefined8 *local_160;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_158;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_150;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_148;
  undefined8 local_140;
  undefined8 *local_138;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_130;
  undefined8 local_128;
  undefined8 *local_120;
  char *local_118;
  char **local_110;
  char *local_108;
  char **local_100;
  char *local_f8;
  char **local_f0;
  char *local_e8;
  char **local_e0;
  char *local_d8;
  char **local_d0;
  char *local_c8;
  size_t sStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined8 *local_a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a0;
  undefined8 local_98;
  undefined8 *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_88;
  char **local_80;
  char *local_78;
  size_t sStack_70;
  char **local_60;
  char *local_58;
  size_t sStack_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_38;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
  **local_30;
  undefined8 local_28;
  undefined8 *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  depth = (int)((ulong)in_stack_fffffffffffff428 >> 0x20);
  uVar11 = (undefined2)((ulong)in_stack_fffffffffffff778 >> 0x30);
  InputStream::InputStream
            (in_stack_fffffffffffff4a0,in_stack_fffffffffffff498,in_stack_fffffffffffff490);
  iVar1 = *(int *)(in_RDI + 0x4c);
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_850);
    InputStream::operator_cast_to_istream_(&local_6d8);
    callback = (function<void_(const_ktx::ValidationReport_&)> *)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x50));
    filepath._M_str._0_4_ = in_stack_fffffffffffff418;
    filepath._M_len = (size_t)in_stack_fffffffffffff410;
    filepath._M_str._4_4_ = in_stack_fffffffffffff41c;
    uVar11 = extraout_var;
    fmtInFile_abi_cxx11_(filepath);
    local_8b8 = local_850;
    std::function<void(ktx::ValidationReport_const&)>::
    function<ktx::CommandValidate::executeValidate()::__0,void>
              (in_stack_fffffffffffff3d0,(anon_class_8_1_38b231ee *)in_stack_fffffffffffff3c8);
    iVar1 = validateIOStream(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                             SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0),callback);
    std::function<void_(const_ktx::ValidationReport_&)>::~function
              ((function<void_(const_ktx::ValidationReport_&)> *)0x2a688e);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff780);
    this_01 = local_850;
    std::__cxx11::ostringstream::str();
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      local_2c0 = local_8e8;
      local_2c8 = "Validation {}\n";
      local_e8 = "Validation {}\n";
      local_8e8[0] = "Validation {}\n";
      local_e0 = local_2c0;
      sStack_2d0 = std::char_traits<char>::length((char_type *)0x2a6940);
      local_18 = local_2c8;
      local_8f0 = (undefined1  [8])0x3a94b5;
      if (iVar1 == 0) {
        local_8f0 = (undefined1  [8])0x386118;
      }
      local_2d8 = local_8e8[0];
      local_2e0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_const_char_*>
                   *)local_8f0;
      local_2f8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,char_const*>
                               (local_2e0,(v10 *)this_01,args_03);
      local_2e8 = local_2f8;
      local_60 = &local_2d8;
      local_308 = local_2d8;
      local_300 = sStack_2d0;
      local_40 = &local_318;
      local_28 = 0xc;
      local_318 = 0xc;
      fmt.data_._4_2_ = in_stack_fffffffffffff3ec;
      fmt.data_._0_4_ = in_stack_fffffffffffff3e8;
      fmt.data_._6_1_ = in_stack_fffffffffffff3ee;
      fmt.data_._7_1_ = in_stack_fffffffffffff3ef;
      fmt.size_ = in_stack_fffffffffffff3f0;
      args.field_1.values_ = in_stack_fffffffffffff3e0.values_;
      args.desc_ = in_stack_fffffffffffff3d8;
      local_58 = local_308;
      sStack_50 = local_300;
      local_48 = local_2e8;
      local_38 = local_2e8;
      local_30 = local_2e8;
      local_20 = local_40;
      local_310 = local_2e8;
      ::fmt::v10::vprint(fmt,args);
      local_260 = &local_900;
      local_268 = "\n";
      local_f8 = "\n";
      local_900 = "\n";
      psVar10 = &local_8f8;
      local_f0 = local_260;
      sVar3 = std::char_traits<char>::length((char_type *)0x2a6b5e);
      *psVar10 = sVar3;
      local_10 = local_268;
      local_278 = local_900;
      sStack_270 = local_8f8;
      local_298[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_280 = local_298;
      local_d0 = &local_278;
      local_2a8 = local_278;
      local_2a0 = sStack_270;
      local_a8 = &local_2b8;
      local_98 = 0;
      local_2b8 = 0;
      fmt_00.data_._4_2_ = in_stack_fffffffffffff3ec;
      fmt_00.data_._0_4_ = in_stack_fffffffffffff3e8;
      fmt_00.data_._6_1_ = in_stack_fffffffffffff3ee;
      fmt_00.data_._7_1_ = in_stack_fffffffffffff3ef;
      fmt_00.size_ = in_stack_fffffffffffff3f0;
      args_00.field_1.values_ = in_stack_fffffffffffff3e0.values_;
      args_00.desc_ = in_stack_fffffffffffff3d8;
      local_c8 = local_2a8;
      sStack_c0 = local_2a0;
      local_b0 = local_280;
      local_a0 = local_280;
      local_90 = local_a8;
      local_88 = local_280;
      local_2b0 = local_280;
      ::fmt::v10::vprint(fmt_00,args_00);
      local_200 = &local_910;
      local_208 = "{}";
      local_108 = "{}";
      local_910 = "{}";
      psVar10 = &local_908;
      local_100 = local_200;
      sVar3 = std::char_traits<char>::length((char_type *)0x2a6d32);
      *psVar10 = sVar3;
      local_8 = local_208;
      local_218 = local_910;
      sStack_210 = local_908;
      local_220 = local_8d8;
      local_238[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff3c8);
      local_228 = local_238;
      local_80 = &local_218;
      local_248 = local_218;
      local_240 = sStack_210;
      local_160 = &local_258;
      local_140 = 0xd;
      local_258 = 0xd;
      fmt_01.data_._4_2_ = in_stack_fffffffffffff3ec;
      fmt_01.data_._0_4_ = in_stack_fffffffffffff3e8;
      fmt_01.data_._6_1_ = in_stack_fffffffffffff3ee;
      fmt_01.data_._7_1_ = in_stack_fffffffffffff3ef;
      fmt_01.size_ = in_stack_fffffffffffff3f0;
      args_01.field_1.values_ = in_stack_fffffffffffff3e0.values_;
      args_01.desc_ = in_stack_fffffffffffff3d8;
      local_168 = local_228;
      local_158 = local_228;
      local_148 = local_228;
      local_138 = local_160;
      local_78 = local_248;
      sStack_70 = local_240;
      local_250 = local_228;
      ::fmt::v10::vprint(fmt_01,args_01);
    }
    if (iVar1 != 0) {
      uVar4 = __cxa_allocate_exception(0x10);
      FatalError::FatalError((FatalError *)in_stack_fffffffffffff3c0,in_stack_fffffffffffff3bc);
      __cxa_throw(uVar4,&FatalError::typeinfo,FatalError::~FatalError);
    }
    std::__cxx11::string::~string(local_8d8);
    std::__cxx11::ostringstream::~ostringstream(local_850);
  }
  else if ((iVar1 == 1) || (iVar1 == 2)) {
    local_914 = 0;
    local_918 = (uint)(*(int *)(in_RDI + 0x4c) == 1) << 2;
    local_928 = "";
    local_920 = "";
    if (*(int *)(in_RDI + 0x4c) == 1) {
      local_920 = " ";
    }
    if (*(int *)(in_RDI + 0x4c) == 1) {
      local_928 = "\n";
    }
    std::__cxx11::ostringstream::ostringstream(local_aa0);
    local_ab0 = local_aa0;
    local_aa8 = local_914;
    local_aa4 = local_918;
    local_ab1 = 1;
    piVar5 = InputStream::operator_cast_to_istream_(&local_6d8);
    local_ae8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x50));
    filepath_00._M_str._0_4_ = in_stack_fffffffffffff418;
    filepath_00._M_len = (size_t)in_stack_fffffffffffff410;
    filepath_00._M_str._4_4_ = in_stack_fffffffffffff41c;
    fmtInFile_abi_cxx11_(filepath_00);
    uVar8 = *(undefined1 *)(in_RDI + 0x48);
    uVar9 = *(undefined1 *)(in_RDI + 0x49);
    local_b28 = &local_ab1;
    local_b20 = &local_ab0;
    local_b18 = &local_928;
    local_b10 = &local_920;
    std::function<void(ktx::ValidationReport_const&)>::
    function<ktx::CommandValidate::executeValidate()::__1,void>
              (in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8);
    iVar1 = validateIOStream(in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                             SUB21((ushort)uVar11 >> 8,0),SUB21(uVar11,0),in_stack_fffffffffffff770)
    ;
    std::function<void_(const_ktx::ValidationReport_&)>::~function
              ((function<void_(const_ktx::ValidationReport_&)> *)0x2a7182);
    std::__cxx11::string::~string(local_ad8);
    local_b38 = &std::cout;
    local_b30 = local_914;
    local_b2c = local_918;
    local_ab8 = iVar1;
    PrintIndent::operator()
              (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
               (char (*) [5])in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    PrintIndent::operator()
              (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,in_stack_fffffffffffff410,
               in_stack_fffffffffffff408,in_stack_fffffffffffff400);
    local_b39 = local_ab8 == 0;
    PrintIndent::operator()
              (in_stack_fffffffffffff430,depth,(char (*) [16])in_stack_fffffffffffff420,
               (char **)CONCAT44(in_stack_fffffffffffff41c,in_stack_fffffffffffff418),
               (bool *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    if ((local_ab1 & 1) == 0) {
      PrintIndent::operator()
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (char (*) [17])in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                 in_stack_fffffffffffff400);
      local_198 = &local_b50;
      local_1a0 = "{}";
      local_118 = "{}";
      local_b50 = "{}";
      paVar7 = &local_b48;
      local_110 = local_198;
      aVar6 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
               )std::char_traits<char>::length((char_type *)0x2a72f5);
      paVar7->values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)aVar6;
      local_d8 = local_1a0;
      std::__cxx11::ostringstream::str();
      local_1b0 = local_b50;
      aStack_1a8 = local_b48;
      local_1b8 = &stack0xfffffffffffff490;
      local_1d8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffff3c8);
      local_1c0 = local_1d8;
      local_190 = &local_1b0;
      local_1e8 = local_1b0;
      local_1e0 = aStack_1a8;
      local_170 = &local_1f8;
      local_128 = 0xd;
      local_1f8 = 0xd;
      fmt_02.data_._4_2_ = in_stack_fffffffffffff3ec;
      fmt_02.data_._0_4_ = iVar1;
      fmt_02.data_._6_1_ = uVar8;
      fmt_02.data_._7_1_ = uVar9;
      fmt_02.size_ = (size_t)piVar5;
      args_02.field_1.values_ = aVar6.values_;
      args_02.desc_ = (unsigned_long_long)paVar7;
      local_188 = local_1e8;
      aStack_180 = local_1e0;
      local_178 = local_1c0;
      local_150 = local_1c0;
      local_130 = local_1c0;
      local_120 = local_170;
      local_1f0 = local_1c0;
      ::fmt::v10::vprint(fmt_02,args_02);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff490);
      PrintIndent::operator()
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (char (*) [5])in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      PrintIndent::operator()
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (char (*) [4])in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    }
    else {
      PrintIndent::operator()
                (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
                 (char (*) [18])in_stack_fffffffffffff410,in_stack_fffffffffffff408,
                 in_stack_fffffffffffff400);
    }
    PrintIndent::operator()
              (in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
               (char (*) [5])in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    if (local_ab8 != 0) {
      this_00 = (FatalError *)__cxa_allocate_exception(0x10);
      FatalError::FatalError(this_00,in_stack_fffffffffffff3bc);
      __cxa_throw(this_00,&FatalError::typeinfo,FatalError::~FatalError);
    }
    std::__cxx11::ostringstream::~ostringstream(local_aa0);
  }
  InputStream::~InputStream(in_stack_fffffffffffff3c0);
  return;
}

Assistant:

void CommandValidate::executeValidate() {
    InputStream inputStream(options.inputFilepath, *this);

    switch (options.format) {
    case OutputFormat::text: {
        std::ostringstream messagesOS;
        const auto validationResult = validateIOStream(
                inputStream,
                fmtInFile(options.inputFilepath),
                options.warningsAsErrors,
                options.GLTFBasisU,
                [&](const ValidationReport& issue) {
            fmt::print(messagesOS, "{}-{:04}: {}\n", toString(issue.type), issue.id, issue.message);
            fmt::print(messagesOS, "    {}\n", issue.details);
        });

        const auto validationMessages = std::move(messagesOS).str();
        if (!validationMessages.empty()) {
            fmt::print("Validation {}\n", validationResult == 0 ? "successful" : "failed");
            fmt::print("\n");
            fmt::print("{}", validationMessages);
        }

        if (validationResult != 0)
            throw FatalError(rc::INVALID_FILE);
        break;
    }
    case OutputFormat::json: [[fallthrough]];
    case OutputFormat::json_mini: {
        const auto base_indent = options.format == OutputFormat::json ? +0 : 0;
        const auto indent_width = options.format == OutputFormat::json ? 4 : 0;
        const auto space = options.format == OutputFormat::json ? " " : "";
        const auto nl = options.format == OutputFormat::json ? "\n" : "";

        std::ostringstream messagesOS;
        PrintIndent pi{messagesOS, base_indent, indent_width};

        bool first = true;
        const auto validationResult = validateIOStream(
                inputStream,
                fmtInFile(options.inputFilepath),
                options.warningsAsErrors,
                options.GLTFBasisU,
                [&](const ValidationReport& issue) {
            if (!std::exchange(first, false)) {
                pi(2, "}},{}", nl);
            }
            pi(2, "{{{}", nl);
            pi(3, "\"id\":{}{},{}", space, issue.id, nl);
            pi(3, "\"type\":{}\"{}\",{}", space, toString(issue.type), nl);
            pi(3, "\"message\":{}\"{}\",{}", space, escape_json_copy(issue.message), nl);
            pi(3, "\"details\":{}\"{}\"{}", space, escape_json_copy(issue.details), nl);
        });

        PrintIndent out{std::cout, base_indent, indent_width};
        out(0, "{{{}", nl);
        out(1, "\"$schema\":{}\"https://schema.khronos.org/ktx/validate_v0.json\",{}", space, nl);
        out(1, "\"valid\":{}{},{}", space, validationResult == 0, nl);
        if (!first) {
            out(1, "\"messages\":{}[{}", space, nl);
            fmt::print("{}", std::move(messagesOS).str());
            out(2, "}}{}", nl);
            out(1, "]{}", nl);
        } else {
            out(1, "\"messages\":{}[]{}", space, nl);
        }
        out(0, "}}{}", nl);

        if (validationResult != 0)
            throw FatalError(rc::INVALID_FILE);
        break;
    }
    }
}